

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

int __thiscall
asl::Array<int>::clone(Array<int> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int *p;
  int n;
  Array<int> *this_local;
  Array<int> *b;
  
  p = *(int **)__fn;
  n = length((Array<int> *)__fn);
  Array(this,p,n);
  return (int)this;
}

Assistant:

Array clone() const
	{
		Array b(_a, length());
		return b;
	}